

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Target.cpp
# Opt level: O3

ModeSelect __thiscall SCSI::Target::CommandState::mode_select_specs(CommandState *this)

{
  byte bVar1;
  pointer puVar2;
  ushort uVar3;
  long lVar4;
  
  puVar2 = (this->data_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(this->data_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
  if (lVar4 == 10) {
    uVar3 = *(ushort *)(puVar2 + 7) << 8 | *(ushort *)(puVar2 + 7) >> 8;
  }
  else if (lVar4 == 6) {
    uVar3 = (ushort)puVar2[4];
  }
  else {
    uVar3 = 0;
  }
  bVar1 = puVar2[1];
  return (ModeSelect)
         ((uint6)((bVar1 & 0x10) == 0) |
         (uint6)((bVar1 & 2) << 7) | CONCAT24(uVar3,(bVar1 & 1) << 0x10));
}

Assistant:

uint16_t CommandState::number_of_blocks() const {
	switch(data_.size()) {
		default:	return 0;
		case 6:
			return uint16_t(data_[4]);
		case 10:
			return uint16_t((data_[7] << 8) | data_[8]);
	}
}